

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

_Bool aom_img_read(aom_image_t *img,FILE *file)

{
  int iVar1;
  aom_img_fmt_t aVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  uchar *__ptr;
  size_t __n;
  
  aVar2 = img->fmt;
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 3) {
      return true;
    }
    __ptr = img->planes[lVar6];
    iVar1 = img->stride[lVar6];
    iVar3 = aom_img_plane_width(img,(int)lVar6);
    iVar4 = aom_img_plane_height(img,(int)lVar6);
    if (lVar6 == 2 && img->fmt == AOM_IMG_FMT_NV12) break;
    __n = (size_t)(iVar3 << (lVar6 == 1 && img->fmt == AOM_IMG_FMT_NV12));
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    while (iVar4 != 0) {
      sVar5 = fread(__ptr,2 - (ulong)((aVar2 & 0x800) == AOM_IMG_FMT_NONE),__n,(FILE *)file);
      if (sVar5 != __n) {
        return false;
      }
      __ptr = __ptr + iVar1;
      iVar4 = iVar4 + -1;
    }
    lVar6 = lVar6 + 1;
  }
  return true;
}

Assistant:

bool aom_img_read(aom_image_t *img, FILE *file) {
  int plane;
  const int bytespp = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    int y;

    // Assuming that for nv12 we read all chroma data at once
    if (img->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (img->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;

    for (y = 0; y < h; ++y) {
      if (fread(buf, bytespp, w, file) != (size_t)w) return false;
      buf += stride;
    }
  }

  return true;
}